

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

void read_and_discard_scanlines(j_decompress_ptr cinfo,JDIMENSION num_lines)

{
  uint in_ESI;
  long in_RDI;
  my_merged_upsample_ptr upsample;
  _func_void_j_decompress_ptr_JSAMPARRAY_JSAMPARRAY_int *color_quantize;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *color_convert;
  JSAMPARRAY scanlines;
  JSAMPROW dummy_row;
  JSAMPLE dummy_sample [1];
  my_master_ptr master;
  JDIMENSION n;
  undefined8 in_stack_ffffffffffffffb8;
  JDIMENSION max_lines;
  JSAMPARRAY scanlines_00;
  j_decompress_ptr cinfo_00;
  undefined1 local_19;
  long local_18;
  uint local_10;
  uint local_c;
  long local_8;
  
  max_lines = (JDIMENSION)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_18 = *(long *)(in_RDI + 0x220);
  local_c = in_ESI;
  local_8 = in_RDI;
  memset(&local_19,0,1);
  cinfo_00 = (j_decompress_ptr)0x0;
  scanlines_00 = (JSAMPARRAY)0x0;
  if ((*(long *)(local_8 + 0x268) != 0) && (*(long *)(*(long *)(local_8 + 0x268) + 8) != 0)) {
    cinfo_00 = *(j_decompress_ptr *)(*(long *)(local_8 + 0x268) + 8);
    *(code **)(*(long *)(local_8 + 0x268) + 8) = noop_convert;
  }
  if ((*(long *)(local_8 + 0x270) != 0) && (*(long *)(*(long *)(local_8 + 0x270) + 8) != 0)) {
    scanlines_00 = *(JSAMPARRAY *)(*(long *)(local_8 + 0x270) + 8);
    *(code **)(*(long *)(local_8 + 0x270) + 8) = noop_quantize;
  }
  if ((*(int *)(local_18 + 0x7c) != 0) && (*(int *)(local_8 + 0x19c) == 2)) {
    max_lines = (JDIMENSION)((ulong)*(undefined8 *)(local_8 + 0x260) >> 0x20);
  }
  for (local_10 = 0; local_10 < local_c; local_10 = local_10 + 1) {
    jpeg_read_scanlines(cinfo_00,scanlines_00,max_lines);
  }
  if (cinfo_00 != (j_decompress_ptr)0x0) {
    *(j_decompress_ptr *)(*(long *)(local_8 + 0x268) + 8) = cinfo_00;
  }
  if (scanlines_00 != (JSAMPARRAY)0x0) {
    *(JSAMPARRAY *)(*(long *)(local_8 + 0x270) + 8) = scanlines_00;
  }
  return;
}

Assistant:

LOCAL(void)
read_and_discard_scanlines(j_decompress_ptr cinfo, JDIMENSION num_lines)
{
  JDIMENSION n;
  my_master_ptr master = (my_master_ptr)cinfo->master;
  JSAMPLE dummy_sample[1] = { 0 };
  JSAMPROW dummy_row = dummy_sample;
  JSAMPARRAY scanlines = NULL;
  void (*color_convert) (j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                         JDIMENSION input_row, JSAMPARRAY output_buf,
                         int num_rows) = NULL;
  void (*color_quantize) (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                          JSAMPARRAY output_buf, int num_rows) = NULL;

  if (cinfo->cconvert && cinfo->cconvert->color_convert) {
    color_convert = cinfo->cconvert->color_convert;
    cinfo->cconvert->color_convert = noop_convert;
    /* This just prevents UBSan from complaining about adding 0 to a NULL
     * pointer.  The pointer isn't actually used.
     */
    scanlines = &dummy_row;
  }

  if (cinfo->cquantize && cinfo->cquantize->color_quantize) {
    color_quantize = cinfo->cquantize->color_quantize;
    cinfo->cquantize->color_quantize = noop_quantize;
  }

  if (master->using_merged_upsample && cinfo->max_v_samp_factor == 2) {
    my_merged_upsample_ptr upsample = (my_merged_upsample_ptr)cinfo->upsample;
    scanlines = &upsample->spare_row;
  }

  for (n = 0; n < num_lines; n++)
    jpeg_read_scanlines(cinfo, scanlines, 1);

  if (color_convert)
    cinfo->cconvert->color_convert = color_convert;

  if (color_quantize)
    cinfo->cquantize->color_quantize = color_quantize;
}